

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11VulkanPlatform.cpp
# Opt level: O1

void __thiscall tcu::x11::VulkanPlatform::describePlatform(VulkanPlatform *this,ostream *dst)

{
  int iVar1;
  size_t sVar2;
  runtime_error *this_00;
  utsname sysInfo;
  utsname local_19e;
  
  memset(&local_19e,0,0x186);
  iVar1 = uname(&local_19e);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(dst,"OS: ",4);
    sVar2 = strlen(local_19e.sysname);
    std::__ostream_insert<char,std::char_traits<char>>(dst,local_19e.sysname,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(dst," ",1);
    sVar2 = strlen(local_19e.release);
    std::__ostream_insert<char,std::char_traits<char>>(dst,local_19e.release,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(dst," ",1);
    sVar2 = strlen(local_19e.version);
    std::__ostream_insert<char,std::char_traits<char>>(dst,local_19e.version,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(dst,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(dst,"CPU: ",5);
    sVar2 = strlen(local_19e.machine);
    std::__ostream_insert<char,std::char_traits<char>>(dst,local_19e.machine,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(dst,"\n",1);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"uname() failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void VulkanPlatform::describePlatform (std::ostream& dst) const
{
	utsname		sysInfo;
	deMemset(&sysInfo, 0, sizeof(sysInfo));

	if (uname(&sysInfo) != 0)
		throw std::runtime_error("uname() failed");

	dst << "OS: " << sysInfo.sysname << " " << sysInfo.release << " " << sysInfo.version << "\n";
	dst << "CPU: " << sysInfo.machine << "\n";
}